

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O0

ym2612_ * YM2612_Init(UINT32 Clock,UINT32 Rate,UINT8 Interpolation)

{
  uint uVar1;
  bool bVar2;
  double dVar3;
  double x;
  int j;
  int i;
  ym2612_ *YM2612;
  UINT8 Interpolation_local;
  UINT32 Rate_local;
  UINT32 Clock_local;
  
  if ((Rate == 0) || (Clock == 0)) {
    _Rate_local = (ym2612_ *)0x0;
  }
  else {
    _Rate_local = (ym2612_ *)calloc(1,0x4958);
    if (_Rate_local != (ym2612_ *)0x0) {
      _Rate_local->Clock = Clock;
      _Rate_local->Rate = Rate;
      _Rate_local->DAC_Highpass_Enable = '\0';
      _Rate_local->Enable_SSGEG = '\0';
      _Rate_local->Frequence = ((double)_Rate_local->Clock / (double)_Rate_local->Rate) / 144.0;
      _Rate_local->TimerBase = (int)(_Rate_local->Frequence * 4096.0);
      if ((Interpolation == '\0') || (_Rate_local->Frequence <= 1.0)) {
        _Rate_local->Inter_Step = 0x4000;
        _Rate_local->Inter_Cnt = 0;
      }
      else {
        _Rate_local->Inter_Step = (uint)(long)((1.0 / _Rate_local->Frequence) * 16384.0);
        _Rate_local->Inter_Cnt = 0;
        _Rate_local->Rate = _Rate_local->Clock / 0x90;
        _Rate_local->Frequence = 1.0;
      }
      for (x._4_4_ = 0; (int)x._4_4_ < 0x3000; x._4_4_ = x._4_4_ + 1) {
        if ((int)x._4_4_ < 0xd00) {
          dVar3 = pow(10.0,((double)(int)x._4_4_ * 0.0234375) / 20.0);
          TL_TAB[(int)x._4_4_] = (int)(268435455.0 / dVar3);
          TL_TAB[(int)(x._4_4_ + 0x3000)] = -TL_TAB[(int)x._4_4_];
        }
        else {
          TL_TAB[(int)x._4_4_] = 0;
          TL_TAB[(int)(x._4_4_ + 0x3000)] = 0;
        }
      }
      SIN_TAB[0x800] = TL_TAB + 0xd00;
      SIN_TAB[0] = TL_TAB + 0xd00;
      for (x._4_4_ = 1; (int)x._4_4_ < 0x401; x._4_4_ = x._4_4_ + 1) {
        dVar3 = sin(((double)(int)x._4_4_ * 6.283185307179586) / 4096.0);
        dVar3 = log10(1.0 / dVar3);
        x._0_4_ = (int)((dVar3 * 20.0) / 0.0234375);
        if (0xd00 < x._0_4_) {
          x._0_4_ = 0xd00;
        }
        SIN_TAB[(int)(0x800 - x._4_4_)] = TL_TAB + x._0_4_;
        SIN_TAB[(int)x._4_4_] = TL_TAB + x._0_4_;
        SIN_TAB[(int)(0x1000 - x._4_4_)] = TL_TAB + (x._0_4_ + 0x3000);
        SIN_TAB[(int)(x._4_4_ + 0x800)] = TL_TAB + (x._0_4_ + 0x3000);
      }
      for (x._4_4_ = 0; (int)x._4_4_ < 0x400; x._4_4_ = x._4_4_ + 1) {
        dVar3 = sin(((double)(int)x._4_4_ * 6.283185307179586) / 1024.0);
        LFO_ENV_TAB[(int)x._4_4_] = (int)(((dVar3 + 1.0) / 2.0) * 503.4666666666667);
        dVar3 = sin(((double)(int)x._4_4_ * 6.283185307179586) / 1024.0);
        LFO_FREQ_TAB[(int)x._4_4_] = (int)(dVar3 * 511.0);
      }
      for (x._4_4_ = 0; (int)x._4_4_ < 0x1000; x._4_4_ = x._4_4_ + 1) {
        dVar3 = pow((double)(int)(0xfff - x._4_4_) / 4096.0,8.0);
        ENV_TAB[(int)x._4_4_] = (int)(dVar3 * 4096.0);
        dVar3 = pow((double)(int)x._4_4_ / 4096.0,1.0);
        ENV_TAB[(int)(x._4_4_ + 0x1000)] = (int)(dVar3 * 4096.0);
      }
      ENV_TAB[0x2000] = 0xfff;
      x._0_4_ = 0xfff;
      for (x._4_4_ = 0; (int)x._4_4_ < 0x1000; x._4_4_ = x._4_4_ + 1) {
        while( true ) {
          bVar2 = false;
          if (x._0_4_ != 0) {
            bVar2 = ENV_TAB[x._0_4_] < x._4_4_;
          }
          if (!bVar2) break;
          x._0_4_ = x._0_4_ + -1;
        }
        DECAY_TO_ATTACK[(int)x._4_4_] = x._0_4_ << 0x10;
      }
      for (x._4_4_ = 0; (int)x._4_4_ < 0xf; x._4_4_ = x._4_4_ + 1) {
        SL_TAB[(int)x._4_4_] = (int)((double)(int)(x._4_4_ * 3) / 0.0234375) * 0x10000 + 0x10000000;
      }
      SL_TAB[0xf] = 0x1fff0000;
      for (x._4_4_ = 0; (int)x._4_4_ < 0x800; x._4_4_ = x._4_4_ + 1) {
        _Rate_local->FINC_TAB[(int)x._4_4_] =
             (uint)(long)((double)(int)x._4_4_ * _Rate_local->Frequence * 4096.0 * 0.5);
      }
      for (x._4_4_ = 0; (int)x._4_4_ < 4; x._4_4_ = x._4_4_ + 1) {
        _Rate_local->AR_TAB[(int)x._4_4_] = 0;
        _Rate_local->DR_TAB[(int)x._4_4_] = 0;
      }
      for (x._4_4_ = 0; (int)x._4_4_ < 0x3c; x._4_4_ = x._4_4_ + 1) {
        dVar3 = _Rate_local->Frequence * ((double)(x._4_4_ & 3) * 0.25 + 1.0) *
                (double)(1 << ((byte)(x._4_4_ >> 2) & 0x1f)) * 268435456.0;
        _Rate_local->AR_TAB[(long)(int)x._4_4_ + 4] = (uint)(long)(dVar3 / 399128.0);
        _Rate_local->DR_TAB[(int)(x._4_4_ + 4)] = (uint)(long)(dVar3 / 5514396.0);
      }
      for (x._4_4_ = 0x40; (int)x._4_4_ < 0x60; x._4_4_ = x._4_4_ + 1) {
        _Rate_local->AR_TAB[(int)x._4_4_] = _Rate_local->AR_TAB[0x3f];
        _Rate_local->DR_TAB[(int)x._4_4_] = _Rate_local->DR_TAB[0x3f];
        NULL_RATE[(int)(x._4_4_ + -0x40)] = 0;
      }
      for (x._4_4_ = 0; (int)x._4_4_ < 4; x._4_4_ = x._4_4_ + 1) {
        for (x._0_4_ = 0; x._0_4_ < 0x20; x._0_4_ = x._0_4_ + 1) {
          dVar3 = (double)DT_DEF_TAB[(int)x._4_4_][x._0_4_] * _Rate_local->Frequence * 32.0;
          _Rate_local->DT_TAB[(int)x._4_4_][x._0_4_] = (int)dVar3;
          _Rate_local->DT_TAB[(int)(x._4_4_ + 4)][x._0_4_] = (int)-dVar3;
        }
      }
      uVar1 = _Rate_local->Rate * _Rate_local->Inter_Step >> 0xe;
      _Rate_local->LFO_INC_TAB[0] = (int)(long)(1068373114.88 / (double)uVar1);
      _Rate_local->LFO_INC_TAB[1] = (int)(long)(1492501135.36 / (double)uVar1);
      _Rate_local->LFO_INC_TAB[2] = (int)(long)(1615981445.12 / (double)uVar1);
      _Rate_local->LFO_INC_TAB[3] = (int)(long)(1709933854.72 / (double)uVar1);
      _Rate_local->LFO_INC_TAB[4] = (int)(long)(1846835937.28 / (double)uVar1);
      _Rate_local->LFO_INC_TAB[5] = (int)(long)(2585033441.28 / (double)uVar1);
      _Rate_local->LFO_INC_TAB[6] = (int)(long)(12911745433.6 / (double)uVar1);
      _Rate_local->LFO_INC_TAB[7] = (int)(long)(19381039923.2 / (double)uVar1);
      YM2612_SetMute(_Rate_local,0);
    }
  }
  return _Rate_local;
}

Assistant:

ym2612_ *YM2612_Init(UINT32 Clock, UINT32 Rate, UINT8 Interpolation)
{
  ym2612_ *YM2612;
  int i, j;
  double x;

  if ((Rate == 0) || (Clock == 0))
    return NULL;

  YM2612 = (ym2612_ *)calloc(1, sizeof(ym2612_));
  if (YM2612 == NULL)
    return YM2612;

#if YM_DEBUG_LEVEL > 0
  if (debug_file == NULL)
  {
    debug_file = fopen("ym2612.log", "w");
    fprintf(debug_file, "YM2612 logging :\n\n");
  }
#endif

  YM2612->Clock = Clock;
  YM2612->Rate = Rate;

  YM2612->DAC_Highpass_Enable = 0;
  YM2612->Enable_SSGEG = 0;

  // 144 = 12 * (prescale * 2) = 12 * 6 * 2
  // prescale set to 6 by default

  YM2612->Frequence = ((double)(YM2612->Clock) / (double)(YM2612->Rate)) / 144.0;
  YM2612->TimerBase = (int) (YM2612->Frequence * 4096.0);

  if ((Interpolation) && (YM2612->Frequence > 1.0))
  {
    YM2612->Inter_Step = (unsigned int) ((1.0 / YM2612->Frequence) * (double) (0x4000));
    YM2612->Inter_Cnt = 0;

    // We recalculate rate and frequence after interpolation

    YM2612->Rate = YM2612->Clock / 144;
    YM2612->Frequence = 1.0;
  }
  else
  {
    YM2612->Inter_Step = 0x4000;
    YM2612->Inter_Cnt = 0;
  }

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "YM2612 frequence = %g rate = %d  interp step = %.8X\n\n", YM2612->Frequence, YM2612->Rate, YM2612->Inter_Step);
#endif

  // Tableau TL :
  // [0     -  4095] = +output  [4095  - ...] = +output overflow (fill with 0)
  // [12288 - 16383] = -output  [16384 - ...] = -output overflow (fill with 0)

  for (i = 0; i < TL_LENGTH; i++)
  {
    if (i >= PG_CUT_OFF)  // YM2612 cut off sound after 78 dB (14 bits output ?)
    {
      TL_TAB[TL_LENGTH + i] = TL_TAB[i] = 0;
    }
    else
    {
      x = MAX_OUT;                // Max output
      x /= pow(10, (ENV_STEP * i) / 20);      // Decibel -> Voltage

      TL_TAB[i] = (int) x;
      TL_TAB[TL_LENGTH + i] = -TL_TAB[i];
    }

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "TL_TAB[%d] = %.8X    TL_TAB[%d] = %.8X\n", i, TL_TAB[i], TL_LENGTH + i, TL_TAB[TL_LENGTH + i]);
#endif
  }

#if YM_DEBUG_LEVEL > 2
  fprintf(debug_file, "\n\n\n\n");
#endif

  // Tableau SIN :
  // SIN_TAB[x][y] = sin(x) * y;
  // x = phase and y = volume

  SIN_TAB[0] = SIN_TAB[SIN_LENGTH / 2] = &TL_TAB[(int) PG_CUT_OFF];

  for (i = 1; i <= SIN_LENGTH / 4; i++)
  {
    x = sin(2.0 * M_PI * (double) (i) / (double) (SIN_LENGTH));  // Sinus
    x = 20 * log10(1 / x);                    // convert to dB

    j = (int) (x / ENV_STEP);            // Get TL range

    if (j > PG_CUT_OFF)
      j = (int) PG_CUT_OFF;

    SIN_TAB[i] = SIN_TAB[(SIN_LENGTH / 2) - i] = &TL_TAB[j];
    SIN_TAB[(SIN_LENGTH / 2) + i] = SIN_TAB[SIN_LENGTH - i] = &TL_TAB[TL_LENGTH + j];

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X\n", i, SIN_TAB[i][0], (SIN_LENGTH / 2) - i, SIN_TAB[(SIN_LENGTH / 2) - i][0], (SIN_LENGTH / 2) + i, SIN_TAB[(SIN_LENGTH / 2) + i][0], SIN_LENGTH - i, SIN_TAB[SIN_LENGTH - i][0]);
#endif
  }

#if YM_DEBUG_LEVEL > 2
  fprintf(debug_file, "\n\n\n\n");
#endif

  // Tableau LFO (LFO wav) :

  for (i = 0; i < LFO_LENGTH; i++)
  {
    x = sin(2.0 * M_PI * (double) (i) / (double) (LFO_LENGTH));  // Sinus
    x += 1.0;
    x /= 2.0;          // positive only
    x *= 11.8 / ENV_STEP;    // ajusted to MAX enveloppe modulation

    LFO_ENV_TAB[i] = (int) x;

    x = sin(2.0 * M_PI * (double) (i) / (double) (LFO_LENGTH));  // Sinus
    x *= (double) ((1 << (LFO_HBITS - 1)) - 1);

    LFO_FREQ_TAB[i] = (int) x;

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "LFO[%d] = %.8X\n", i, LFO_ENV_TAB[i]);
#endif
  }

#if YM_DEBUG_LEVEL > 2
  fprintf(debug_file, "\n\n\n\n");
#endif

  // Tableau Enveloppe :
  // ENV_TAB[0] -> ENV_TAB[ENV_LENGTH - 1]        = attack curve
  // ENV_TAB[ENV_LENGTH] -> ENV_TAB[2 * ENV_LENGTH - 1]  = decay curve

  for (i = 0; i < ENV_LENGTH; i++)
  {
    // Attack curve (x^8 - music level 2 Vectorman 2)
    x = pow(((double) ((ENV_LENGTH - 1) - i) / (double) (ENV_LENGTH)), 8);
    x *= ENV_LENGTH;

    ENV_TAB[i] = (int) x;

    // Decay curve (just linear)
    x = pow(((double) (i) / (double) (ENV_LENGTH)), 1);
    x *= ENV_LENGTH;

    ENV_TAB[ENV_LENGTH + i] = (int) x;

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "ATTACK[%d] = %d   DECAY[%d] = %d\n", i, ENV_TAB[i], i, ENV_TAB[ENV_LENGTH + i]);
#endif
  }

  ENV_TAB[ENV_END >> ENV_LBITS] = ENV_LENGTH - 1;    // for the stopped state

  // Tableau pour la conversion Attack -> Decay and Decay -> Attack

  for (i = 0, j = ENV_LENGTH - 1; i < ENV_LENGTH; i++)
  {
    while (j && (ENV_TAB[j] < (unsigned) i))
      j--;

    DECAY_TO_ATTACK[i] = j << ENV_LBITS;
  }

  // Tableau pour le Substain Level

  for (i = 0; i < 15; i++)
  {
    x = i * 3;          // 3 and not 6 (Mickey Mania first music for test)
    x /= ENV_STEP;

    j = (int) x;
    j <<= ENV_LBITS;

    SL_TAB[i] = j + ENV_DECAY;
  }

  j = ENV_LENGTH - 1;        // special case : volume off
  j <<= ENV_LBITS;
  SL_TAB[15] = j + ENV_DECAY;

  // Tableau Frequency Step

  for (i = 0; i < 2048; i++)
  {
    x = (double) (i) * YM2612->Frequence;

    #if ((SIN_LBITS + SIN_HBITS - (21 - 7)) < 0)
      x /= (double) (1 << ((21 - 7) - SIN_LBITS - SIN_HBITS));
    #else
      x *= (double) (1 << (SIN_LBITS + SIN_HBITS - (21 - 7)));
    #endif

    x /= 2.0;  // because MUL = value * 2

    YM2612->FINC_TAB[i] = (unsigned int) x;
  }

  // Tableaux Attack & Decay Rate

  for (i = 0; i < 4; i++)
  {
    YM2612->AR_TAB[i] = 0;
    YM2612->DR_TAB[i] = 0;
  }

  for (i = 0; i < 60; i++)
  {
    x = YM2612->Frequence;

    x *= 1.0 + ((i & 3) * 0.25);                // bits 0-1 : x1.00, x1.25, x1.50, x1.75
    x *= (double) (1 << ((i >> 2)));            // bits 2-5 : shift bits (x2^0 - x2^15)
    x *= (double) (ENV_LENGTH << ENV_LBITS);    // on ajuste pour le tableau ENV_TAB

    YM2612->AR_TAB[i + 4] = (unsigned int) (x / AR_RATE);
    YM2612->DR_TAB[i + 4] = (unsigned int) (x / DR_RATE);
  }

  for (i = 64; i < 96; i++)
  {
    YM2612->AR_TAB[i] = YM2612->AR_TAB[63];
    YM2612->DR_TAB[i] = YM2612->DR_TAB[63];

    NULL_RATE[i - 64] = 0;
  }

  // Tableau Detune

  for (i = 0; i < 4; i++)
  {
    for (j = 0; j < 32; j++)
    {
      #if ((SIN_LBITS + SIN_HBITS - 21) < 0)
        x = (double)DT_DEF_TAB[i][j] * YM2612->Frequence /
            (double)(1 << (21 - SIN_LBITS - SIN_HBITS));
      #else
        x = (double)DT_DEF_TAB[i][j] * YM2612->Frequence *
            (double)(1 << (SIN_LBITS + SIN_HBITS - 21));
      #endif

      YM2612->DT_TAB[i + 0][j] = (int) x;
      YM2612->DT_TAB[i + 4][j] = (int) -x;
    }
  }

  // Tableau LFO

  j = (YM2612->Rate * YM2612->Inter_Step) / 0x4000;

  YM2612->LFO_INC_TAB[0] = (unsigned int) (3.98 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[1] = (unsigned int) (5.56 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[2] = (unsigned int) (6.02 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[3] = (unsigned int) (6.37 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[4] = (unsigned int) (6.88 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[5] = (unsigned int) (9.63 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[6] = (unsigned int) (48.1 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[7] = (unsigned int) (72.2 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);

  YM2612_SetMute(YM2612, 0x00);
  //YM2612_Reset(YM2612);

  return YM2612;
}